

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsParallel.h
# Opt level: O3

void __thiscall highs::parallel::TaskGroup::sync(TaskGroup *this)

{
  HighsSplitDeque *this_00;
  HighsTask *stolenTask;
  pair<HighsSplitDeque::Status,_HighsTask_*> pVar1;
  
  this_00 = this->workerDeque;
  pVar1 = HighsSplitDeque::pop(this_00);
  stolenTask = pVar1.second;
  if (pVar1.first == kWork) {
    if ((stolenTask->metadata).stealer.super___atomic_base<unsigned_long>._M_i == 0) {
      (*(code *)**(undefined8 **)stolenTask->taskData)(stolenTask);
      return;
    }
  }
  else if (pVar1.first == kStolen) {
    HighsTaskExecutor::sync_stolen_task(this_00,stolenTask);
    return;
  }
  return;
}

Assistant:

void sync() const {
    assert(workerDeque->getCurrentHead() > dequeHead);
    highs::parallel::sync(workerDeque);
  }